

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O0

int check_matrix_entry(SUNMatrix A,sunrealtype val,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  sunindextype i;
  sunindextype Aldata;
  sunrealtype *Adata;
  int failure;
  long local_40;
  int local_24;
  uint local_4;
  
  local_24 = 0;
  lVar2 = SUNDenseMatrix_Data(in_RDI);
  lVar3 = SUNDenseMatrix_LData(in_RDI);
  for (local_40 = 0; local_40 < lVar3; local_40 = local_40 + 1) {
    iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + local_40 * 8),in_XMM0_Qa,in_XMM1_Qa);
    local_24 = iVar1 + local_24;
  }
  if (0.0 < (double)local_24) {
    printf("Check_matrix_entry failures:\n");
    for (local_40 = 0; local_40 < lVar3; local_40 = local_40 + 1) {
      iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + local_40 * 8),in_XMM0_Qa,in_XMM1_Qa);
      if (iVar1 != 0) {
        printf("  Adata[%ld] = %g != %g (err = %g)\n",*(undefined8 *)(lVar2 + local_40 * 8),
               in_XMM0_Qa,ABS(*(double *)(lVar2 + local_40 * 8) - in_XMM0_Qa),local_40);
      }
    }
  }
  local_4 = (uint)(0.0 < (double)local_24);
  return local_4;
}

Assistant:

int check_matrix_entry(SUNMatrix A, sunrealtype val, sunrealtype tol)
{
  int failure = 0;
  sunrealtype* Adata;
  sunindextype Aldata;
  sunindextype i;

  /* get data pointer */
  Adata = SUNDenseMatrix_Data(A);

  /* compare data */
  Aldata = SUNDenseMatrix_LData(A);
  for (i = 0; i < Aldata; i++)
  {
    failure += SUNRCompareTol(Adata[i], val, tol);
  }

  if (failure > ZERO)
  {
    printf("Check_matrix_entry failures:\n");
    for (i = 0; i < Aldata; i++)
    {
      if (SUNRCompareTol(Adata[i], val, tol) != 0)
      {
        printf("  Adata[%ld] = %" GSYM " != %" GSYM " (err = %" GSYM ")\n",
               (long int)i, Adata[i], val, SUNRabs(Adata[i] - val));
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}